

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O2

int Am_Width_Of_Parts_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object comp;
  Am_Value_List components;
  
  Am_Value_List::Am_Value_List(&components);
  comp.data = (Am_Object_Data *)0x0;
  pAVar5 = Am_Object::Get(self,0x82,0);
  Am_Value_List::operator=(&components,pAVar5);
  Am_Value_List::Start(&components);
  iVar4 = 0;
  while( true ) {
    bVar1 = Am_Value_List::Last(&components);
    if (bVar1) break;
    pAVar5 = Am_Value_List::Get(&components);
    Am_Object::operator=(&comp,pAVar5);
    pAVar5 = Am_Object::Get(&comp,0x69,0);
    bVar1 = Am_Value::Valid(pAVar5);
    if (bVar1) {
      pAVar5 = Am_Object::Get(&comp,100,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar5);
      pAVar5 = Am_Object::Get(&comp,0x66,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar5);
      if (iVar4 <= iVar3 + iVar2) {
        iVar4 = iVar3 + iVar2;
      }
    }
    Am_Value_List::Next(&components);
  }
  pAVar5 = Am_Object::Get(self,0xa0,5);
  bVar1 = Am_Value::Exists(pAVar5);
  if (bVar1) {
    pAVar5 = Am_Object::Get(self,0xa0,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    iVar4 = iVar2 + iVar4;
  }
  Am_Object::~Am_Object(&comp);
  Am_Value_List::~Am_Value_List(&components);
  return iVar4;
}

Assistant:

Am_Define_Formula(int, Am_Width_Of_Parts)
{
  int max_x = 0, comp_right;
  Am_Value_List components;
  Am_Object comp;
  components = self.Get(Am_GRAPHICAL_PARTS);
  for (components.Start(); !components.Last(); components.Next()) {
    comp = components.Get();
    if (comp.Get(Am_VISIBLE).Valid()) {
      // compute how much of the component extends right of the origin
      comp_right = ((int)(comp.Get(Am_LEFT)) + (int)(comp.Get(Am_WIDTH)));
      max_x = imax(max_x, comp_right);
    }
  }
  if (self.Peek(Am_RIGHT_OFFSET, Am_NO_DEPENDENCY).Exists())
    max_x += (int)self.Get(Am_RIGHT_OFFSET);
  return max_x; // always >=0 since it's initialized to 0
}